

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

void __thiscall
Js::CustomExternalWrapperObject::Mark(CustomExternalWrapperObject *this,Recycler *recycler)

{
  RecyclableObject *UNRECOVERED_JUMPTABLE;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  
  Memory::Recycler::SetNeedExternalWrapperTracing(recycler);
  UNRECOVERED_JUMPTABLE =
       (this->super_DynamicObject).super_RecyclableObject.type.ptr[1].prototype.ptr;
  if (UNRECOVERED_JUMPTABLE == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0xd2,"(nullptr != traceCallback)","nullptr != traceCallback");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pvVar4 = GetSlotData(this);
  (*(code *)UNRECOVERED_JUMPTABLE)(pvVar4);
  return;
}

Assistant:

void CustomExternalWrapperObject::Mark(Recycler * recycler)
{
    recycler->SetNeedExternalWrapperTracing();
    JsTraceCallback traceCallback = this->GetExternalType()->GetJsTraceCallback();
    Assert(nullptr != traceCallback);
    traceCallback(this->GetSlotData());
}